

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

void __thiscall Shell::parseModuleAssertion(Shell *this,Element *s)

{
  byte bVar1;
  bool bVar2;
  Element *pEVar3;
  Fatal *this_00;
  bool *pbVar4;
  anon_class_16_2_42fb14a4 visitor;
  anon_class_16_2_42fb14a4 visitor_00;
  anon_class_16_2_4322515e visitor_01;
  anon_class_16_2_42fb14a4 visitor_02;
  undefined1 auVar5 [16];
  char local_809;
  Module *local_808;
  Fatal local_800;
  TrapException *anon_var_0_1;
  WasmException *e;
  Shell *pSStack_660;
  ElementUtils *local_650;
  Module *local_648;
  anon_class_16_2_42fb14a4 *local_640;
  Module *local_638;
  Shell *pSStack_630;
  Shell *local_628;
  Shell *pSStack_620;
  Module *pMStack_618;
  anon_class_16_2_42fb14a4 reportUnknownImport;
  ParseException *anon_var_0;
  undefined1 local_391 [8];
  bool invalid;
  IString id;
  unique_ptr<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
  builder;
  FeatureSet local_364;
  undefined1 local_360 [8];
  Module wasm;
  Element *s_local;
  Shell *this_local;
  
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)s;
  ::wasm::Module::Module((Module *)local_360);
  ::wasm::FeatureSet::FeatureSet(&local_364,0x1efff);
  wasm.debugInfoFileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_364.features;
  std::unique_ptr<wasm::SExpressionWasmBuilder,std::default_delete<wasm::SExpressionWasmBuilder>>::
  unique_ptr<std::default_delete<wasm::SExpressionWasmBuilder>,void>
            ((unique_ptr<wasm::SExpressionWasmBuilder,std::default_delete<wasm::SExpressionWasmBuilder>>
              *)&id.str._M_str);
  ::wasm::Element::operator[]((uint)wasm.tagsMap._M_h._M_single_bucket);
  auVar5 = ::wasm::Element::str();
  id.str._M_len = auVar5._8_8_;
  register0x00000000 = auVar5._0_8_;
  local_391[0] = 0;
  pEVar3 = (Element *)::wasm::Element::operator[]((uint)wasm.tagsMap._M_h._M_single_bucket);
  pbVar4 = (bool *)0x0;
  ::wasm::SExpressionWasmBuilder::SExpressionWasmBuilder
            ((SExpressionWasmBuilder *)&anon_var_0,(Module *)local_360,pEVar3,Normal);
  ::wasm::SExpressionWasmBuilder::~SExpressionWasmBuilder((SExpressionWasmBuilder *)&anon_var_0);
  if ((local_391[0] & 1) == 0) {
    bVar1 = ::wasm::WasmValidator::validate
                      ((Module *)((long)&reportUnknownImport.invalid + 7),(uint)local_360);
    local_391[0] = (bVar1 ^ 0xff) & 1;
  }
  if (((local_391[0] & 1) == 0) &&
     (bVar2 = ::wasm::IString::operator==
                        ((IString *)(local_391 + 1),&ASSERT_UNLINKABLE.super_IString), bVar2)) {
    pSStack_620 = (Shell *)local_391;
    visitor.invalid = pbVar4;
    visitor.this = pSStack_620;
    local_628 = this;
    pMStack_618 = (Module *)this;
    reportUnknownImport.this = pSStack_620;
    ::wasm::ModuleUtils::
    iterImportedGlobals<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Importable*)_1_>
              ((ModuleUtils *)local_360,(Module *)this,visitor);
    local_638 = pMStack_618;
    pSStack_630 = reportUnknownImport.this;
    visitor_00.invalid = pbVar4;
    visitor_00.this = reportUnknownImport.this;
    ::wasm::ModuleUtils::
    iterImportedTables<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Importable*)_1_>
              ((ModuleUtils *)local_360,pMStack_618,visitor_00);
    local_640 = (anon_class_16_2_42fb14a4 *)&pMStack_618;
    ::wasm::ModuleUtils::
    iterImportedFunctions<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Importable*)_2_>
              ((Module *)local_360,(anon_class_8_1_d0a1351b)local_640);
    local_650 = (ElementUtils *)local_360;
    local_648 = (Module *)local_391;
    visitor_01.invalid = pbVar4;
    visitor_01.wasm = local_648;
    ::wasm::ElementUtils::
    iterAllElementFunctionNames<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Name)_1_>
              (local_650,(Module *)local_650,visitor_01);
    e = (WasmException *)pMStack_618;
    pSStack_660 = reportUnknownImport.this;
    visitor_02.invalid = pbVar4;
    visitor_02.this = reportUnknownImport.this;
    ::wasm::ModuleUtils::
    iterImportedMemories<Shell::parseModuleAssertion(wasm::Element&)::_lambda(wasm::Importable*)_1_>
              ((ModuleUtils *)local_360,pMStack_618,visitor_02);
  }
  if (((local_391[0] & 1) == 0) &&
     (bVar2 = ::wasm::IString::operator==((IString *)(local_391 + 1),&ASSERT_TRAP.super_IString),
     bVar2)) {
    instantiate(this,(Module *)local_360);
  }
  if ((local_391[0] & 1) != 0) {
    std::
    unique_ptr<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>::
    ~unique_ptr((unique_ptr<wasm::SExpressionWasmBuilder,_std::default_delete<wasm::SExpressionWasmBuilder>_>
                 *)&id.str._M_str);
    ::wasm::Module::~Module((Module *)local_360);
    return;
  }
  Colors::red((ostream *)&std::cerr);
  std::operator<<((ostream *)&std::cerr,"[should have been invalid]\n");
  Colors::normal((ostream *)&std::cerr);
  ::wasm::Fatal::Fatal(&local_800);
  local_808 = (Module *)local_360;
  this_00 = ::wasm::Fatal::operator<<(&local_800,&local_808);
  local_809 = '\n';
  ::wasm::Fatal::operator<<(this_00,&local_809);
  ::wasm::Fatal::~Fatal(&local_800);
}

Assistant:

void parseModuleAssertion(Element& s) {
    Module wasm;
    wasm.features = FeatureSet::All;
    std::unique_ptr<SExpressionWasmBuilder> builder;
    auto id = s[0]->str();

    bool invalid = false;
    try {
      SExpressionWasmBuilder(wasm, *s[1], IRProfile::Normal);
    } catch (const ParseException&) {
      invalid = true;
    }

    if (!invalid) {
      // maybe parsed ok, but otherwise incorrect
      invalid = !WasmValidator().validate(wasm);
    }

    if (!invalid && id == ASSERT_UNLINKABLE) {
      // validate "instantiating" the mdoule
      auto reportUnknownImport = [&](Importable* import) {
        auto it = linkedInstances.find(import->module);
        if (it == linkedInstances.end() ||
            it->second->wasm.getExportOrNull(import->base) == nullptr) {
          std::cerr << "unknown import: " << import->module << '.'
                    << import->base << '\n';
          invalid = true;
        }
      };
      ModuleUtils::iterImportedGlobals(wasm, reportUnknownImport);
      ModuleUtils::iterImportedTables(wasm, reportUnknownImport);
      ModuleUtils::iterImportedFunctions(wasm, [&](Importable* import) {
        if (import->module == SPECTEST && import->base.startsWith(PRINT)) {
          // We can handle it.
        } else {
          reportUnknownImport(import);
        }
      });
      ElementUtils::iterAllElementFunctionNames(&wasm, [&](Name name) {
        // spec tests consider it illegal to use spectest.print in a table
        if (auto* import = wasm.getFunction(name)) {
          if (import->imported() && import->module == SPECTEST &&
              import->base.startsWith(PRINT)) {
            std::cerr << "cannot put spectest.print in table\n";
            invalid = true;
          }
        }
      });
      ModuleUtils::iterImportedMemories(wasm, reportUnknownImport);
    }

    if (!invalid && id == ASSERT_TRAP) {
      try {
        instantiate(&wasm);
      } catch (const TrapException&) {
        invalid = true;
      } catch (const WasmException& e) {
        std::cout << "[exception thrown: " << e << "]" << std::endl;
        invalid = true;
      }
    }

    if (!invalid) {
      Colors::red(std::cerr);
      std::cerr << "[should have been invalid]\n";
      Colors::normal(std::cerr);
      Fatal() << &wasm << '\n';
    }
  }